

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::HasField(CrateReader *this,string *key)

{
  pointer pFVar1;
  int iVar2;
  string *psVar3;
  pointer pFVar4;
  optional<tinyusdz::Token> fv;
  optional<tinyusdz::Token> local_50;
  
  pFVar4 = (this->_fields).
           super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->_fields).
           super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pFVar4 == pFVar1) {
LAB_00172c38:
      return pFVar4 != pFVar1;
    }
    GetToken(&local_50,this,(Index)(pFVar4->token_index).super_Index.value);
    if (local_50.has_value_ == true) {
      psVar3 = (string *)nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_50);
      iVar2 = ::std::__cxx11::string::compare(psVar3);
      if (iVar2 == 0) {
        nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_50);
        goto LAB_00172c38;
      }
    }
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_50);
    pFVar4 = pFVar4 + 1;
  } while( true );
}

Assistant:

bool CrateReader::HasField(const std::string &key) const {
  // Simple linear search
  for (const auto &field : _fields) {
    if (auto fv = GetToken(field.token_index)) {
      if (fv.value().str().compare(key) == 0) {
        return true;
      }
    }
  }
  return false;
}